

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<PointeeAdaptor_Relational_Test>::CreateTest
          (TestFactoryImpl<PointeeAdaptor_Relational_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<PointeeAdaptor_Relational_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x38);
  PointeeAdaptor_Relational_Test::PointeeAdaptor_Relational_Test
            ((PointeeAdaptor_Relational_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }